

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

ProString * __thiscall
QHash<ProKey,_ProString>::value
          (ProString *__return_storage_ptr__,QHash<ProKey,_ProString> *this,ProKey *key)

{
  ProString *other;
  
  other = valueImpl<ProKey>(this,key);
  if (other == (ProString *)0x0) {
    ProString::ProString(__return_storage_ptr__);
  }
  else {
    ProString::ProString(__return_storage_ptr__,other);
  }
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }